

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::ReadListFile(cmMakefile *this,cmListFile *listFile,string *filenametoread)

{
  Snapshot *this_00;
  bool bVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  cmExecutionStatus status;
  string currentFile;
  string currentParentFile;
  allocator local_b1;
  string local_b0;
  string local_90;
  string local_70;
  char *local_50 [4];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->ListFiles,filenametoread);
  std::__cxx11::string::string((string *)&local_70,"CMAKE_PARENT_LIST_FILE",(allocator *)&local_b0);
  pcVar2 = GetSafeDefinition(this,&local_70);
  std::__cxx11::string::string((string *)local_50,pcVar2,(allocator *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_b0,"CMAKE_CURRENT_LIST_FILE",(allocator *)&local_90)
  ;
  pcVar2 = GetSafeDefinition(this,&local_b0);
  std::__cxx11::string::string((string *)&local_70,pcVar2,&local_b1);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_b0,"CMAKE_CURRENT_LIST_FILE",(allocator *)&local_90)
  ;
  AddDefinition(this,&local_b0,(filenametoread->_M_dataplus)._M_p);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_b0,"CMAKE_CURRENT_LIST_DIR",&local_b1);
  cmsys::SystemTools::GetFilenamePath(&local_90,filenametoread);
  AddDefinition(this,&local_b0,local_90._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_b0,"CMAKE_PARENT_LIST_FILE",(allocator *)&local_90);
  this_00 = &this->StateSnapshot;
  cmState::Snapshot::GetDefinition(this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_b0,"CMAKE_CURRENT_LIST_FILE",(allocator *)&local_90)
  ;
  cmState::Snapshot::GetDefinition(this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_b0,"CMAKE_CURRENT_LIST_DIR",(allocator *)&local_90);
  cmState::Snapshot::GetDefinition(this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  lVar4 = ((long)(listFile->Functions).
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(listFile->Functions).
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start >> 6) + 1;
  lVar3 = 0;
  while (lVar4 = lVar4 + -1, lVar4 != 0) {
    local_b0._M_dataplus._M_p._0_4_ = 0;
    ExecuteCommand(this,(cmListFileFunction *)
                        ((long)&(((listFile->Functions).
                                  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->super_cmCommandContext
                                ).Name + lVar3),(cmExecutionStatus *)&local_b0);
    bVar1 = cmSystemTools::GetFatalErrorOccured();
    if ((bVar1) || (lVar3 = lVar3 + 0x40, (char)local_b0._M_dataplus._M_p != '\0')) break;
  }
  CheckForUnusedVariables(this);
  std::__cxx11::string::string((string *)&local_b0,"CMAKE_PARENT_LIST_FILE",(allocator *)&local_90);
  AddDefinition(this,&local_b0,local_50[0]);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_b0,"CMAKE_CURRENT_LIST_FILE",(allocator *)&local_90)
  ;
  AddDefinition(this,&local_b0,local_70._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_b0,"CMAKE_CURRENT_LIST_DIR",&local_b1);
  cmsys::SystemTools::GetFilenamePath(&local_90,&local_70);
  AddDefinition(this,&local_b0,local_90._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_b0,"CMAKE_PARENT_LIST_FILE",(allocator *)&local_90);
  cmState::Snapshot::GetDefinition(this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_b0,"CMAKE_CURRENT_LIST_FILE",(allocator *)&local_90)
  ;
  cmState::Snapshot::GetDefinition(this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_b0,"CMAKE_CURRENT_LIST_DIR",(allocator *)&local_90);
  cmState::Snapshot::GetDefinition(this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void cmMakefile::ReadListFile(cmListFile const& listFile,
                              std::string const& filenametoread)
{
  // add this list file to the list of dependencies
  this->ListFiles.push_back(filenametoread);

  std::string currentParentFile
      = this->GetSafeDefinition("CMAKE_PARENT_LIST_FILE");
  std::string currentFile
    = this->GetSafeDefinition("CMAKE_CURRENT_LIST_FILE");

  this->AddDefinition("CMAKE_CURRENT_LIST_FILE", filenametoread.c_str());
  this->AddDefinition("CMAKE_CURRENT_LIST_DIR",
                       cmSystemTools::GetFilenamePath(filenametoread).c_str());

  this->MarkVariableAsUsed("CMAKE_PARENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_DIR");

  // Run the parsed commands.
  const size_t numberFunctions = listFile.Functions.size();
  for(size_t i =0; i < numberFunctions; ++i)
    {
    cmExecutionStatus status;
    this->ExecuteCommand(listFile.Functions[i],status);
    if(cmSystemTools::GetFatalErrorOccured())
      {
      break;
      }
    if(status.GetReturnInvoked())
      {
      // Exit early due to return command.
      break;
      }
    }
  this->CheckForUnusedVariables();

  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentParentFile.c_str());
  this->AddDefinition("CMAKE_CURRENT_LIST_FILE", currentFile.c_str());
  this->AddDefinition("CMAKE_CURRENT_LIST_DIR",
                      cmSystemTools::GetFilenamePath(currentFile).c_str());
  this->MarkVariableAsUsed("CMAKE_PARENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_DIR");
}